

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

Error asmjit::formatFuncDetailValue
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,Value value)

{
  uint logOptions_00;
  Error EVar1;
  uint in_ECX;
  StringBuilder *in_RDX;
  uint32_t in_ESI;
  StringBuilder *in_RDI;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  uint32_t typeId;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint local_64 [2];
  undefined1 local_59;
  size_t *local_40;
  size_t *local_38;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  uint *local_18;
  uint *local_10;
  uint *local_8;
  
  local_30 = local_64;
  logOptions_00 = in_ECX >> 0x18;
  local_64[0] = in_ECX;
  EVar1 = formatTypeId(in_RDI,in_ESI);
  if (EVar1 != 0) {
    return EVar1;
  }
  local_28 = local_64;
  if ((local_64[0] & 0x10000) != 0) {
    local_59 = 0x3a;
    EVar1 = StringBuilder::_opChar
                      ((StringBuilder *)((ulong)logOptions_00 << 0x20),in_stack_ffffffffffffff74,
                       (char)(in_stack_ffffffffffffff70 >> 0x18));
    if (EVar1 != 0) {
      return EVar1;
    }
    local_40 = &in_RDX->_length;
    local_20 = local_64;
    local_18 = local_64;
    local_38 = local_40;
    EVar1 = Logging::formatRegister
                      (in_RDX,logOptions_00,(CodeEmitter *)(ulong)in_stack_ffffffffffffff70,
                       in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,0);
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  local_10 = local_64;
  if ((local_64[0] & 0x20000) != 0) {
    local_8 = local_64;
    EVar1 = StringBuilder::appendFormat(in_RDI,":[%d]",(ulong)(local_64[0] & 0xffff));
    if (EVar1 != 0) {
      return EVar1;
    }
  }
  return 0;
}

Assistant:

static Error formatFuncDetailValue(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  FuncDetail::Value value) noexcept {

  uint32_t typeId = value.getTypeId();
  ASMJIT_PROPAGATE(formatTypeId(sb, typeId));

  if (value.byReg()) {
    ASMJIT_PROPAGATE(sb.appendChar(':'));
    ASMJIT_PROPAGATE(Logging::formatRegister(sb, logOptions, emitter, emitter->getArchType(), value.getRegType(), value.getRegId()));
  }

  if (value.byStack()) {
    ASMJIT_PROPAGATE(sb.appendFormat(":[%d]", static_cast<int>(value.getStackOffset())));
  }

  return kErrorOk;
}